

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool wallet::LoadHDChain(CWallet *pwallet,DataStream *ssValue,string *strErr)

{
  LegacyDataSPKM *this;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CHDChain chain;
  unique_lock<std::recursive_mutex> local_68;
  CHDChain local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  local_58.m_next_external_index = 0;
  local_58.m_next_internal_index = 0;
  local_58.nVersion = 2;
  local_58.nExternalChainCounter = 0;
  local_58.nInternalChainCounter = 0;
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  CHDChain::SerializationOps<DataStream,wallet::CHDChain,ActionUnserialize>(&local_58,ssValue);
  this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
  LegacyDataSPKM::LoadHDChain(this,&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadHDChain(CWallet* pwallet, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CHDChain chain;
        ssValue >> chain;
        pwallet->GetOrCreateLegacyDataSPKM()->LoadHDChain(chain);
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}